

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_TVFS.cpp
# Opt level: O0

int __thiscall
TRootHandler_TVFS::CaptureVfsSpanEntries
          (TRootHandler_TVFS *this,TVFS_DIRECTORY_HEADER *DirHeader,PENCODED_KEY pEKey,
          PDWORD PtrSpanSize,DWORD dwVfsOffset)

{
  byte bVar1;
  DWORD DVar2;
  DWORD DVar3;
  byte *pbVar4;
  LPBYTE pBVar5;
  DWORD dwSpanSize;
  DWORD dwSpanCount;
  DWORD dwCftOffset;
  size_t ItemSize;
  LPBYTE pbTemp;
  LPBYTE pbCftFileEnd;
  LPBYTE pbCftFileEntry;
  LPBYTE pbCftFileTable;
  LPBYTE pbVfsFileEnd;
  LPBYTE pbVfsFileEntry;
  LPBYTE pbVfsFileTable;
  PDWORD pDStack_30;
  DWORD dwVfsOffset_local;
  PDWORD PtrSpanSize_local;
  PENCODED_KEY pEKey_local;
  TVFS_DIRECTORY_HEADER *DirHeader_local;
  TRootHandler_TVFS *this_local;
  
  pbVfsFileEntry = DirHeader->pbDirectoryData + DirHeader->VfsTableOffset;
  pbVar4 = pbVfsFileEntry + dwVfsOffset;
  pbCftFileTable = pbVfsFileEntry + DirHeader->VfsTableSize;
  ItemSize = 0;
  if ((pbVar4 < pbVfsFileEntry) || (pbCftFileTable < pbVar4)) {
    this_local._4_4_ = 0x16;
  }
  else {
    pbVfsFileEnd = pbVar4 + 1;
    bVar1 = *pbVar4;
    if ((bVar1 == 0) || (0xe0 < bVar1)) {
      this_local._4_4_ = 1000;
    }
    else {
      pbVfsFileTable._4_4_ = dwVfsOffset;
      pDStack_30 = PtrSpanSize;
      PtrSpanSize_local = (PDWORD)pEKey;
      pEKey_local = (PENCODED_KEY)DirHeader;
      DirHeader_local = (TVFS_DIRECTORY_HEADER *)this;
      if (bVar1 != 1) {
        __assert_fail("dwSpanCount == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascRootFile_TVFS.cpp"
                      ,0x106,
                      "int TRootHandler_TVFS::CaptureVfsSpanEntries(TVFS_DIRECTORY_HEADER &, PENCODED_KEY, PDWORD, DWORD)"
                     );
      }
      pBVar5 = CaptureArray_(pbVfsFileEnd,pbCftFileTable,(LPBYTE *)&ItemSize,
                             (ulong)DirHeader->CftOffsSize + 8,1);
      if (pBVar5 == (LPBYTE)0x0) {
        this_local._4_4_ = 1000;
      }
      else {
        DVar2 = ConvertBytesToInteger_X(pbVfsFileEnd + 8,*(DWORD *)pEKey_local[3].Value);
        DVar3 = ConvertBytesToInteger_4(pbVfsFileEnd + 4);
        pbCftFileEntry =
             (LPBYTE)(*(long *)(pEKey_local[3].Value + 8) +
                     (ulong)*(uint *)(pEKey_local[1].Value + 0xc));
        pbCftFileEnd = pbCftFileEntry + DVar2;
        pbTemp = pbCftFileEntry + *(uint *)pEKey_local[2].Value;
        if (pbTemp < pbCftFileEnd + (int)(uint)pEKey_local->Value[6]) {
          this_local._4_4_ = 1000;
        }
        else {
          memcpy(PtrSpanSize_local,pbCftFileEnd,(ulong)pEKey_local->Value[6]);
          *pDStack_30 = DVar3;
          this_local._4_4_ = 0;
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int CaptureVfsSpanEntries(TVFS_DIRECTORY_HEADER & DirHeader, PENCODED_KEY pEKey, PDWORD PtrSpanSize, DWORD dwVfsOffset)
    {
        LPBYTE pbVfsFileTable = DirHeader.pbDirectoryData + DirHeader.VfsTableOffset;
        LPBYTE pbVfsFileEntry = pbVfsFileTable + dwVfsOffset;
        LPBYTE pbVfsFileEnd = pbVfsFileTable + DirHeader.VfsTableSize;
        LPBYTE pbCftFileTable;
        LPBYTE pbCftFileEntry;
        LPBYTE pbCftFileEnd;
        LPBYTE pbTemp = NULL;
        size_t ItemSize = sizeof(DWORD) + sizeof(DWORD) + DirHeader.CftOffsSize;
        DWORD dwCftOffset;
        DWORD dwSpanCount;
        DWORD dwSpanSize;

        // Get the number of span entries
        if(!(pbVfsFileTable <= pbVfsFileEntry && pbVfsFileEntry <= pbVfsFileEnd))
            return ERROR_INVALID_PARAMETER;
        dwSpanCount = *pbVfsFileEntry++;

        // 1 - 224 = valid file, 225-254 = other file, 255 = deleted file
        // We will ignore all files with unsupported span count
        if(dwSpanCount == 0 || dwSpanCount > 224)
            return ERROR_BAD_FORMAT;

        // So far we've only saw entries with 1 span.
        // Need to test files with multiple spans. Ignore such files for now.
        assert(dwSpanCount == 1);

        // Capture the array of span items
        if(CaptureArray_(pbVfsFileEntry, pbVfsFileEnd, &pbTemp, ItemSize, dwSpanCount) == NULL)
            return ERROR_BAD_FORMAT;

        //
        // Structure of the span entry:
        // (4bytes): Offset into the referenced file (big endian)
        // (4bytes): Size of the span (big endian)
        // (?bytes): Offset into Container File Table. Length depends on container file table size
        //

        // Get the offset to the Container File Table
        dwCftOffset = ConvertBytesToInteger_X(pbVfsFileEntry + sizeof(DWORD) + sizeof(DWORD), DirHeader.CftOffsSize);
        dwSpanSize = ConvertBytesToInteger_4(pbVfsFileEntry + sizeof(DWORD));

        // Go to the Container File Table and fetch the EKey from there
        pbCftFileTable = DirHeader.pbDirectoryData + DirHeader.CftTableOffset;
        pbCftFileEntry = pbCftFileTable + dwCftOffset;
        pbCftFileEnd = pbCftFileTable + DirHeader.CftTableSize;
        if((pbCftFileEntry + DirHeader.EKeySize) > pbCftFileEnd)
            return ERROR_BAD_FORMAT;

        // Give the pointer to the EKey
        memcpy(pEKey->Value, pbCftFileEntry, DirHeader.EKeySize);
        PtrSpanSize[0] = dwSpanSize;
        return ERROR_SUCCESS;
    }